

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4_function_override.cpp
# Opt level: O0

char * do_left(char *str,uint ct)

{
  char *pcVar1;
  uint local_24;
  int i;
  char *result;
  uint ct_local;
  char *str_local;
  
  pcVar1 = (char *)operator_new__((ulong)(ct + 1));
  for (local_24 = 0; local_24 < ct; local_24 = local_24 + 1) {
    pcVar1[(int)local_24] = str[(int)local_24];
  }
  while (local_24 <= ct) {
    pcVar1[(int)local_24] = '\0';
    local_24 = local_24 + 1;
  }
  return pcVar1;
}

Assistant:

char * do_left(const char * str, unsigned ct) {
    char * result = new char[ct + 1];// prepare last \0
    int i = 0;
    for (i; i < ct; i++) {
        result[i] = str[i];
    }
    while(i <= ct) {
        result[i++] = '\0';
    }
    return result;
}